

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O3

Result * __thiscall
testing::internal::
FunctionMocker<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&)>
::Invoke(Result *__return_storage_ptr__,
        FunctionMocker<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&)>
        *this,vector<unsigned_char,_std::allocator<unsigned_char>_> *args)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  UntypedActionResultHolderBase *pUVar4;
  long lVar5;
  UntypedActionResultHolderBase *pUVar6;
  bool bVar7;
  ArgumentTuple tuple;
  GTestLog local_24;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_20;
  
  local_20 = args;
  pUVar4 = UntypedFunctionMockerBase::UntypedInvokeWith
                     (&this->super_UntypedFunctionMockerBase,&local_20);
  if (pUVar4 == (UntypedActionResultHolderBase *)0x0) {
    bVar7 = true;
  }
  else {
    lVar5 = __dynamic_cast(pUVar4,&UntypedActionResultHolderBase::typeinfo,
                           &ActionResultHolder<std::__cxx11::string>::typeinfo,0);
    bVar7 = lVar5 != 0;
  }
  bVar7 = IsTrue(bVar7);
  if (!bVar7) {
    GTestLog::GTestLog(&local_24,GTEST_FATAL,
                       "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/googletest/repo/googletest/include/gtest/internal/gtest-port.h"
                       ,0x44d);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "Condition f == nullptr || dynamic_cast<To>(f) != nullptr failed. ",0x41);
    GTestLog::~GTestLog(&local_24);
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pUVar6 = pUVar4 + 3;
  if ((UntypedActionResultHolderBase *)pUVar4[1]._vptr_UntypedActionResultHolderBase == pUVar6) {
    uVar1 = *(undefined4 *)((long)&pUVar4[3]._vptr_UntypedActionResultHolderBase + 4);
    uVar2 = *(undefined4 *)&pUVar4[4]._vptr_UntypedActionResultHolderBase;
    uVar3 = *(undefined4 *)((long)&pUVar4[4]._vptr_UntypedActionResultHolderBase + 4);
    *(undefined4 *)&__return_storage_ptr__->field_2 =
         *(undefined4 *)&pUVar6->_vptr_UntypedActionResultHolderBase;
    *(undefined4 *)((long)&__return_storage_ptr__->field_2 + 4) = uVar1;
    *(undefined4 *)((long)&__return_storage_ptr__->field_2 + 8) = uVar2;
    *(undefined4 *)((long)&__return_storage_ptr__->field_2 + 0xc) = uVar3;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p =
         (pointer)pUVar4[1]._vptr_UntypedActionResultHolderBase;
    (__return_storage_ptr__->field_2)._M_allocated_capacity =
         (size_type)pUVar6->_vptr_UntypedActionResultHolderBase;
  }
  __return_storage_ptr__->_M_string_length =
       (size_type)pUVar4[2]._vptr_UntypedActionResultHolderBase;
  pUVar4[1]._vptr_UntypedActionResultHolderBase = (_func_int **)pUVar6;
  pUVar4[2]._vptr_UntypedActionResultHolderBase = (_func_int **)0x0;
  *(undefined1 *)&pUVar4[3]._vptr_UntypedActionResultHolderBase = 0;
  (*pUVar4->_vptr_UntypedActionResultHolderBase[1])(pUVar4);
  return __return_storage_ptr__;
}

Assistant:

GTEST_LOCK_EXCLUDED_(g_gmock_mutex) {
    ArgumentTuple tuple(std::forward<Args>(args)...);
    std::unique_ptr<ResultHolder> holder(DownCast_<ResultHolder*>(
        this->UntypedInvokeWith(static_cast<void*>(&tuple))));
    return holder->Unwrap();
  }